

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord2h>(Attribute *this,texcoord2h *v)

{
  half hVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::texcoord2h> ret;
  optional<tinyusdz::value::texcoord2h> local_24;
  optional<tinyusdz::value::texcoord2h> local_1e;
  
  if (v == (texcoord2h *)0x0) {
    local_24.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::texcoord2h>(&local_24,&this->_var);
    local_1e.has_value_ = local_24.has_value_;
    if (local_24.has_value_ != false) {
      local_1e.contained = local_24.contained;
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::value(&local_1e);
      hVar1.value = (pvVar2->t).value;
      v->s = (half)(pvVar2->s).value;
      v->t = (half)hVar1.value;
    }
  }
  return local_24.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }